

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

bool __thiscall
capnp::InterfaceSchema::extends(InterfaceSchema *this,InterfaceSchema other,uint *counter)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint64_t id;
  unsigned_long i;
  ulong uVar4;
  Reader superclass;
  Reader superclasses;
  Schema local_d0;
  StructReader local_c8;
  Reader local_90;
  ListReader local_60;
  
  uVar1 = *counter;
  *counter = uVar1 + 1;
  if (uVar1 < 0x40) {
    if ((Schema)(this->super_Schema).raw == other.super_Schema.raw) {
      bVar3 = true;
    }
    else {
      Schema::getProto(&local_90,&this->super_Schema);
      local_c8.dataSize = local_90._reader.dataSize;
      local_c8.pointerCount = local_90._reader.pointerCount;
      local_c8._38_2_ = local_90._reader._38_2_;
      local_c8.nestingLimit = local_90._reader.nestingLimit;
      local_c8._44_4_ = local_90._reader._44_4_;
      local_c8.data = local_90._reader.data;
      local_c8.pointers = local_90._reader.pointers;
      local_c8.segment = local_90._reader.segment;
      local_c8.capTable = local_90._reader.capTable;
      capnp::schema::Node::Interface::Reader::getSuperclasses
                ((Reader *)&local_60,(Reader *)&local_c8);
      uVar4 = 0;
      do {
        bVar3 = local_60.elementCount != uVar4;
        if (local_60.elementCount == uVar4) {
          return bVar3;
        }
        capnp::_::ListReader::getStructElement(&local_c8,&local_60,(ElementCount)uVar4);
        if (local_c8.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *local_c8.data;
        }
        local_d0 = Schema::getDependency(&this->super_Schema,id,(ElementCount)uVar4 | 0x4000000);
        local_90._reader.segment = (SegmentReader *)Schema::asInterface(&local_d0);
        bVar2 = extends((InterfaceSchema *)&local_90,other,counter);
        uVar4 = uVar4 + 1;
      } while (!bVar2);
    }
  }
  else {
    bVar3 = false;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              ((Fault *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x267,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::_::Debug::Fault::~Fault((Fault *)&local_60);
  }
  return bVar3;
}

Assistant:

bool InterfaceSchema::extends(InterfaceSchema other, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return false;
  }

  if (other == *this) {
    return true;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    if (getDependency(superclass.getId(), location).asInterface().extends(other, counter)) {
      return true;
    }
  }

  return false;
}